

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupPublicPrivate.cpp
# Opt level: O3

string * writeToFile(string *__return_storage_ptr__,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *publics,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *privates,string *classString)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pbVar3;
  undefined8 uVar4;
  long lVar5;
  char cVar6;
  pointer pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_60 [2];
  long local_50 [2];
  string *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  cVar6 = (char)classString;
  local_40 = __return_storage_ptr__;
  local_38 = publics;
  lVar5 = std::__cxx11::string::find(cVar6,0x7b);
  pcVar2 = (classString->_M_dataplus)._M_p;
  classString->_M_string_length = lVar5 + 1;
  pcVar2[lVar5 + 1] = '\0';
  std::__cxx11::string::push_back(cVar6);
  pbVar7 = (privates->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (privates->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar7 != pbVar3) {
    do {
      std::__cxx11::string::push_back(cVar6);
      lVar5 = std::__cxx11::string::find((char)pbVar7,0x3b);
      pcVar2 = (pbVar7->_M_dataplus)._M_p;
      pbVar7->_M_string_length = lVar5 + 1;
      pcVar2[lVar5 + 1] = '\0';
      pcVar2 = (pbVar7->_M_dataplus)._M_p;
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,pcVar2,pcVar2 + pbVar7->_M_string_length);
      std::__cxx11::string::append((char *)local_60);
      std::__cxx11::string::_M_append((char *)classString,(ulong)local_60[0]);
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar3);
  }
  std::__cxx11::string::append((char *)classString);
  pbVar7 = (local_38->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (local_38->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar7 != pbVar3) {
    do {
      std::__cxx11::string::push_back(cVar6);
      lVar5 = std::__cxx11::string::find((char)pbVar7,0x3b);
      pcVar2 = (pbVar7->_M_dataplus)._M_p;
      pbVar7->_M_string_length = lVar5 + 1;
      pcVar2[lVar5 + 1] = '\0';
      pcVar2 = (pbVar7->_M_dataplus)._M_p;
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,pcVar2,pcVar2 + pbVar7->_M_string_length);
      std::__cxx11::string::append((char *)local_60);
      std::__cxx11::string::_M_append((char *)classString,(ulong)local_60[0]);
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar3);
  }
  std::__cxx11::string::append((char *)classString);
  (local_40->_M_dataplus)._M_p = (pointer)&local_40->field_2;
  pcVar2 = (classString->_M_dataplus)._M_p;
  paVar1 = &classString->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar4 = *(undefined8 *)((long)&classString->field_2 + 8);
    (local_40->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&local_40->field_2 + 8) = uVar4;
  }
  else {
    (local_40->_M_dataplus)._M_p = pcVar2;
    (local_40->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_40->_M_string_length = classString->_M_string_length;
  (classString->_M_dataplus)._M_p = (pointer)paVar1;
  classString->_M_string_length = 0;
  (classString->field_2)._M_local_buf[0] = '\0';
  return local_40;
}

Assistant:

std::string writeToFile(std::vector<std::string> &publics, std::vector<std::string> &privates, std::string classString) {
    std::size_t pos = classString.find('{');
    classString.erase(classString.begin()+pos+1, classString.end());
    classString += '\n';
    for (auto & i : privates) {
        classString += '\t';
        stringNormalizer(i);
        classString += i + "\n\n";
    }
    classString += "public:\n\n";
    for (auto & j : publics) {
        classString += '\t';
        stringNormalizer(j);
        classString += j + "\n\n";
    }
    classString += "};\n";
    return classString;
}